

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_value.cpp
# Opt level: O2

ScalarFunction * duckdb::UnionValueFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  code *local_b8 [2];
  code *local_a8;
  code *local_a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  LogicalType local_78 [24];
  allocator local_60 [24];
  LogicalType local_48 [24];
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"union_value",local_60);
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_78,UNION);
  local_b8[1] = (code *)0x0;
  local_b8[0] = UnionValueFunction;
  local_a0 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_48,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_b8);
  duckdb::LogicalType::~LogicalType(local_78);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  std::__cxx11::string::~string(local_30);
  duckdb::LogicalType::LogicalType((LogicalType *)local_60,ANY);
  LogicalType::operator=((LogicalType *)&in_RDI->field_0x78,(LogicalType *)local_60);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_60);
  in_RDI->field_0xa9 = 1;
  in_RDI->serialize = VariableReturnBindData::Serialize;
  in_RDI->deserialize = VariableReturnBindData::Deserialize;
  return in_RDI;
}

Assistant:

ScalarFunction UnionValueFun::GetFunction() {
	ScalarFunction fun("union_value", {}, LogicalTypeId::UNION, UnionValueFunction, UnionValueBind, nullptr, nullptr);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.serialize = VariableReturnBindData::Serialize;
	fun.deserialize = VariableReturnBindData::Deserialize;
	return fun;
}